

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
::select_variables(solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                   *this,int r_size,int bk)

{
  int *piVar1;
  int local_18;
  int local_14;
  int bk_local;
  int r_size_local;
  solver_equalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  *this_local;
  
  local_18 = bk;
  local_14 = r_size;
  _bk_local = this;
  piVar1 = std::min<int>(&local_18,&local_14);
  return *piVar1 + -1;
}

Assistant:

int select_variables(const int r_size, const int bk)
    {
        // We need to affect all the bk variables even if the reduced cost sign
        // change.
        // For example: v + x + y + z = 2
        // bk = 2, r_size = 4
        // This function returns 1 i.e, we select the 0 and 1 variables.

        return std::min(bk, r_size) - 1;
    }